

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest-simpleweb.hh
# Opt level: O1

void __thiscall
discordpp::RestSimpleWeb<discordpp::Bot>::doCall
          (RestSimpleWeb<discordpp::Bot> *this,sptr<RenderedCall> *call)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *this_00;
  pointer pcVar4;
  io_context *self;
  long *plVar5;
  ostream *poVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  string_view content;
  __string_type target;
  CaseInsensitiveMultimap headers;
  ostringstream targetss;
  undefined1 local_309;
  long *local_308;
  size_t local_300;
  long local_2f8 [2];
  element_type *local_2e8;
  string local_2e0;
  _Any_data local_2c0;
  code *local_2b0;
  undefined1 local_2a0 [32];
  _Alloc_hider local_280;
  undefined1 local_278 [24];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_SimpleWeb::CaseInsensitiveEqual,_SimpleWeb::CaseInsensitiveHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  local_1e0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"/api/v",6);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  peVar2 = (((call->
             super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->target).
           super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,(peVar2->_M_dataplus)._M_p,peVar2->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2a0,(char (*) [14])"authorization",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&(this->super_Bot).field_0x90 + (long)(this->super_Bot)._vptr_Bot[-3]));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[22],_const_char_(&)[12],_true>
            (&local_260,(char (*) [22])"X-RateLimit-Precision",(char (*) [12])"millisecond");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_220,(char (*) [11])"User-Agent",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&(this->super_Bot).field_0xb8 + (long)(this->super_Bot)._vptr_Bot[-3]));
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&local_1e0,local_2a0,&local_1e0,0,&local_308,&local_2c0,&local_309);
  lVar8 = -0xc0;
  paVar7 = &local_220.second.field_2;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
    }
    if (&paVar7->_M_allocated_capacity + -4 != (size_type *)(&paVar7->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar7->_M_allocated_capacity)[-6],
                      (&paVar7->_M_allocated_capacity)[-4] + 1);
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar7->_M_allocated_capacity + -8);
    lVar8 = lVar8 + 0x40;
  } while (lVar8 != 0);
  peVar3 = (call->super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if ((peVar3->type).
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[13],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2a0,(char (*) [13])"Content-Type",
               (peVar3->type).
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&local_1e0,0,local_2a0);
    if (local_280._M_p != local_278 + 8) {
      operator_delete(local_280._M_p,local_278._8_8_ + 1);
    }
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
  }
  this_00 = *(ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
              **)&(this->super_Bot).field_0x80;
  peVar3 = (call->super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_2e8 = (peVar3->method).
              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  peVar2 = (peVar3->body).
           super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_308 = local_2f8;
  if (peVar2 == (element_type *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
  }
  else {
    pcVar4 = (peVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,pcVar4,pcVar4 + peVar2->_M_string_length);
  }
  plVar5 = local_308;
  local_2a0._8_8_ =
       (call->super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_2a0._16_8_ =
       (call->super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._16_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._16_8_)->_M_use_count + 1;
    }
  }
  local_2a0._24_8_ = local_278;
  local_2a0._0_8_ = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2a0 + 0x18),local_2e0._M_dataplus._M_p,
             local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
  std::
  function<void(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>,std::error_code_const&)>
  ::
  function<discordpp::RestSimpleWeb<discordpp::Bot>::doCall(std::shared_ptr<discordpp::BotStruct::RenderedCall>)::_lambda(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>,std::error_code_const&)_1_,void>
            ((function<void(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>,std::error_code_const&)>
              *)local_2c0._M_pod_data,(anon_class_56_3_fbde57b0 *)local_2a0);
  content._M_str = (char *)plVar5;
  content._M_len = local_300;
  SimpleWeb::
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
  request(this_00,local_2e8,&local_2e0,content,(CaseInsensitiveMultimap *)&local_1e0,
          (function<void_(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response>,_const_std::error_code_&)>
           *)&local_2c0);
  if (local_2b0 != (code *)0x0) {
    (*local_2b0)(&local_2c0,&local_2c0,__destroy_functor);
  }
  if ((undefined1 *)local_2a0._24_8_ != local_278) {
    operator_delete((void *)local_2a0._24_8_,local_278._0_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._16_8_);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308,local_2f8[0] + 1);
  }
  peVar3 = (call->super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if ((peVar3->onWrite).
      super___shared_ptr<const_std::function<void_(bool)>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    self = *(io_context **)(&(this->super_Bot).field_0x80 + (long)(this->super_Bot)._vptr_Bot[-3]);
    local_2a0._8_8_ =
         (call->super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if ((element_type *)local_2a0._8_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(((element_type *)local_2a0._8_8_)->method).
                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &(((element_type *)local_2a0._8_8_)->method).
                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
    local_2a0._0_8_ = peVar3;
    asio::io_context::initiate_post::operator()
              ((initiate_post *)&local_308,(anon_class_16_1_898a275c_for_handler_ *)local_2a0,self);
    if ((element_type *)local_2a0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_SimpleWeb::CaseInsensitiveEqual,_SimpleWeb::CaseInsensitiveHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void doCall(sptr<RenderedCall> call) override {
        std::ostringstream targetss;
        targetss << "/api/v" << apiVersion << *call->target;
        auto target = targetss.str();
        SimpleWeb::CaseInsensitiveMultimap headers{{"authorization", token},{"X-RateLimit-Precision", "millisecond"}, {"User-Agent", user_agent_}};
        if (call->type) {
            headers.insert({"Content-Type", *call->type});
        }
        client_->request(
            *call->method, target, call->body ? *call->body : "",
            headers,
            [this, call,
             target](std::shared_ptr<HttpsClient::Response> response,
                     const SimpleWeb::error_code &ec) {
                if (ec) {
                    if (call->onRead)
                        aioc->post([call] { (*call->onRead)(true, {}); });
                    return fail(ec, "read", call);
                }

                json jres;
                {
                    std::ostringstream ss;
                    ss << response->content.rdbuf();
                    const std::string &body = ss.str();
                    log::log(log::trace, [body](std::ostream *log) {
                        *log << "Received: " << body << '\n';
                    });
                    if (!body.empty()) {
                        if (body.at(0) == '{' || body.at(0) == '[') {
                            jres = {{"body", json::parse(body)}};
                        } else {
                            std::cerr
                                << "Discord replied:\n"
                                << ss.str() << "\nTo the following target:\n"
                                << target << "\nWith the following payload:\n"
                                << *call->body << std::endl;
                        }
                    }
                }

                int status = std::stoi(response->status_code);
                jres["result"] = status;

                for (auto h :
                     {"X-RateLimit-Global", "X-RateLimit-Limit",
                      "X-RateLimit-Remaining", "X-RateLimit-Reset",
                      "X-RateLimit-Reset-After", "X-RateLimit-Bucket"}) {
                    auto it = response->header.find(h);
                    if (it != response->header.end()) {
                        jres["header"][h] = it->second;
                    }
                }

                if (jres.find("embed") != jres.end()) {
                    std::cout << "Discord API didn't like the following parts "
                                 "of your "
                                 "embed: ";
                    bool first = true;
                    for (const json &part : jres["embed"]) {
                        if (first) {
                            first = false;
                        } else {
                            std::cout << ", ";
                        }
                        std::cout << part.get<std::string>();
                    }
                    std::cout << std::endl;
                }

                log::log(log::debug, [call, jres](std::ostream *log) {
                    *log << "Read " << call->target << jres.dump(4) << '\n';
                });

                if (status < 200 || status >= 300) {
                    log::log(log::error, [call, jres](std::ostream *log) {
                        *log << "Discord sent an error! " << call->target
                             << jres.dump(4) << '\n';
                    });
                }

                if (call->onRead) {
                    aioc->post([call, jres, status]() {
                        (*call->onRead)(status < 200 || status >= 300, jres);
                    });
                }
            });
        if (call->onWrite) {
            aioc->post([call]() {
                (*call->onWrite)(false);
            });
        }
    }